

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warning.cpp
# Opt level: O0

bool tryProcessParamWarning(char *flag,uint8_t param,WarningState state)

{
  undefined1 uVar1;
  int iVar2;
  WarningState local_38;
  undefined1 local_32;
  uint8_t ofs;
  ulong uStack_30;
  uint8_t maxParam;
  size_t i;
  WarningID baseID;
  WarningState state_local;
  uint8_t param_local;
  char *flag_local;
  
  i._4_4_ = 0x10;
  uStack_30 = 0;
  while( true ) {
    if (2 < uStack_30) {
      return false;
    }
    uVar1 = paramWarnings[uStack_30].nbLevels;
    iVar2 = strcmp(paramWarnings[uStack_30].name,flag);
    if (iVar2 == 0) break;
    i._4_4_ = i._4_4_ + (uint)(byte)uVar1;
    uStack_30 = uStack_30 + 1;
  }
  if ((param == '\0') && (state != WARNING_DISABLED)) {
    baseID._3_1_ = paramWarnings[uStack_30].defaultLevel;
  }
  else {
    baseID._3_1_ = param;
    if (((byte)uVar1 < param) && (baseID._3_1_ = uVar1, param != 0xff)) {
      warnx("Got parameter %u for warning flag \"%s\", but the maximum is %u; capping.\n",
            (ulong)param,flag,(ulong)(byte)uVar1);
    }
  }
  for (local_32 = WARNING_ASSERT >> 0x18; (byte)local_32 < (byte)uVar1; local_32 = local_32 + 1) {
    local_38 = state;
    if ((byte)baseID._3_1_ <= (byte)local_32) {
      local_38 = WARNING_DISABLED;
    }
    warningStates[(int)(i._4_4_ + (uint)(byte)local_32)] = local_38;
  }
  return true;
}

Assistant:

static bool tryProcessParamWarning(char const *flag, uint8_t param, enum WarningState state)
{
	enum WarningID baseID = PARAM_WARNINGS_START;

	for (size_t i = 0; i < ARRAY_SIZE(paramWarnings); i++) {
		uint8_t maxParam = paramWarnings[i].nbLevels;

		if (!strcmp(paramWarnings[i].name, flag)) { // Match!
			// If making the warning an error but param is 0, set to the maximum
			// This accommodates `-Werror=flag`, but also `-Werror=flag=0`, which is
			// thus filtered out by the caller.
			// A param of 0 makes sense for disabling everything, but neither for
			// enabling nor "erroring". Use the default for those.
			if (param == 0 && state != WARNING_DISABLED) {
				param = paramWarnings[i].defaultLevel;
			} else if (param > maxParam) {
				if (param != 255) // Don't  warn if already capped
					warnx("Got parameter %" PRIu8
					      " for warning flag \"%s\", but the maximum is %"
					      PRIu8 "; capping.\n",
					      param, flag, maxParam);
				param = maxParam;
			}

			// Set the first <param> to enabled/error, and disable the rest
			for (uint8_t ofs = 0; ofs < maxParam; ofs++) {
				warningStates[baseID + ofs] =
					ofs < param ? state : WARNING_DISABLED;
			}
			return true;
		}

		baseID = (enum WarningID)(baseID + maxParam);
	}
	return false;
}